

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O2

int __thiscall H264StreamReader::calcPicOrder(H264StreamReader *this,SliceUnit *slice)

{
  ushort uVar1;
  bool bVar2;
  ostream *poVar3;
  undefined4 *puVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint *local_1a8;
  undefined8 local_1a0;
  uint local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  ostringstream ss;
  
  if (slice->sps->pic_order_cnt_type != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar3 = std::operator<<((ostream *)&ss,"SPS picture order ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3," not supported.");
    puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar4 = 0x12e;
    *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
    if (local_1a8 == &local_198) {
      puVar4[6] = local_198;
      puVar4[7] = uStack_194;
      puVar4[8] = uStack_190;
      puVar4[9] = uStack_18c;
    }
    else {
      *(uint **)(puVar4 + 2) = local_1a8;
      *(ulong *)(puVar4 + 6) = CONCAT44(uStack_194,local_198);
    }
    *(undefined8 *)(puVar4 + 4) = local_1a0;
    local_198 = local_198 & 0xffffff00;
    __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  bVar2 = SliceUnit::isIDR(slice);
  if (bVar2) {
    this->prevPicOrderCntMsb = 0;
    this->prevPicOrderCntLsb = 0;
    iVar7 = 0;
  }
  else {
    iVar7 = this->prevPicOrderCntLsb;
  }
  iVar6 = 1 << ((byte)slice->sps->log2_max_pic_order_cnt_lsb & 0x1f);
  uVar1 = slice->pic_order_cnt_lsb;
  uVar5 = (uint)uVar1;
  if (((int)(uint)uVar1 < iVar7) && (iVar6 / 2 <= (int)(iVar7 - (uint)uVar1))) {
    iVar6 = iVar6 + this->prevPicOrderCntMsb;
  }
  else if ((iVar7 < (int)(uint)uVar1) && (iVar6 / 2 < (int)(uVar5 - iVar7))) {
    iVar6 = this->prevPicOrderCntMsb - iVar6;
  }
  else {
    iVar6 = this->prevPicOrderCntMsb;
  }
  if (slice->memory_management_control_operation == 5) {
    this->prevPicOrderCntMsb = 0;
    uVar5 = iVar6 + (uint)uVar1;
    if (slice->bottom_field_flag != 0) {
      uVar5 = 0;
    }
  }
  else {
    this->prevPicOrderCntMsb = iVar6;
  }
  this->prevPicOrderCntLsb = uVar5;
  return (int)(iVar6 + (uint)uVar1) >> ((byte)this->m_forceLsbDiv & 0x1f);
}

Assistant:

int H264StreamReader::calcPicOrder(const SliceUnit &slice)
{
    if (slice.getSPS()->pic_order_cnt_type != 0)
        THROW(ERR_H264_UNSUPPORTED_PARAMETER,
              "SPS picture order " << slice.getSPS()->pic_order_cnt_type << " not supported.")

    if (slice.isIDR())
        prevPicOrderCntMsb = prevPicOrderCntLsb = 0;

    const int PicOrderCntLsb = slice.pic_order_cnt_lsb;
    const int MaxPicOrderCntLsb = 1 << slice.getSPS()->log2_max_pic_order_cnt_lsb;
    int PicOrderCntMsb;

    if ((PicOrderCntLsb < prevPicOrderCntLsb) && ((prevPicOrderCntLsb - PicOrderCntLsb) >= (MaxPicOrderCntLsb / 2)))
        PicOrderCntMsb = prevPicOrderCntMsb + MaxPicOrderCntLsb;
    else if ((PicOrderCntLsb > prevPicOrderCntLsb) && ((PicOrderCntLsb - prevPicOrderCntLsb) > (MaxPicOrderCntLsb / 2)))
        PicOrderCntMsb = prevPicOrderCntMsb - MaxPicOrderCntLsb;
    else
        PicOrderCntMsb = prevPicOrderCntMsb;

    if (slice.memory_management_control_operation == 5)
    {
        prevPicOrderCntMsb = 0;
        if (!slice.bottom_field_flag)
            prevPicOrderCntLsb = PicOrderCntMsb + PicOrderCntLsb;
        else
            prevPicOrderCntLsb = 0;
    }
    else
    {
        prevPicOrderCntMsb = PicOrderCntMsb;
        prevPicOrderCntLsb = PicOrderCntLsb;
    }
    return (PicOrderCntMsb + PicOrderCntLsb) >> m_forceLsbDiv;
}